

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack18_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3ffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x12;
  out[1] = (uVar1 >> 0x12) + base + (in[1] & 0xf) * 0x4000;
  out[2] = (in[1] >> 4 & 0x3ffff) + base;
  uVar1 = in[1];
  out[3] = uVar1 >> 0x16;
  out[3] = (uVar1 >> 0x16) + base + (in[2] & 0xff) * 0x400;
  out[4] = (in[2] >> 8 & 0x3ffff) + base;
  uVar1 = in[2];
  out[5] = uVar1 >> 0x1a;
  out[5] = (uVar1 >> 0x1a) + base + (in[3] & 0xfff) * 0x40;
  out[6] = (in[3] >> 0xc & 0x3ffff) + base;
  uVar1 = in[3];
  out[7] = uVar1 >> 0x1e;
  out[7] = (uVar1 >> 0x1e) + base + (in[4] & 0xffff) * 4;
  return in + 5;
}

Assistant:

uint32_t * unpack18_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 18 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 18 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 18 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 18 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 18 - 16 );
    *out += base;
    out++;

    return in + 1;
}